

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O0

settings_pack *
libtorrent::load_pack_from_dict(settings_pack *__return_storage_ptr__,bdecode_node *settings)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  int iVar1;
  bool bVar2;
  int iVar3;
  type_t tVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  value_type *pvVar8;
  int64_t iVar9;
  value_type *pvVar10;
  value_type *pvVar11;
  string_view sVar12;
  allocator<char> local_159;
  string_view local_158;
  string local_148;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_128;
  pointer local_118;
  pointer pbStack_110;
  int local_fc;
  undefined1 auStack_f8 [4];
  int k_2;
  pointer local_e8;
  pointer pbStack_e0;
  uint local_cc;
  undefined1 auStack_c8 [4];
  int k_1;
  pointer local_b8;
  pointer pbStack_b0;
  uint local_9c;
  byte local_95;
  int k;
  bool found;
  type *ptStack_90;
  type *val;
  type *key;
  int local_20;
  undefined1 local_19;
  int i;
  bdecode_node *settings_local;
  settings_pack *pack;
  
  local_19 = 0;
  _i = settings;
  settings_local = (bdecode_node *)__return_storage_ptr__;
  settings_pack::settings_pack(__return_storage_ptr__);
  local_20 = 0;
  do {
    iVar1 = local_20;
    iVar3 = bdecode_node::dict_size(_i);
    if (iVar3 <= iVar1) {
      return __return_storage_ptr__;
    }
    bdecode_node::dict_at
              ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
                *)&key,_i,local_20);
    val = (type *)::std::
                  get<0ul,std::basic_string_view<char,std::char_traits<char>>,libtorrent::bdecode_node>
                            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
                              *)&key);
    ptStack_90 = ::std::
                 get<1ul,std::basic_string_view<char,std::char_traits<char>>,libtorrent::bdecode_node>
                           ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
                             *)&key);
    tVar4 = bdecode_node::type(ptStack_90);
    switch(tVar4) {
    case none_t:
      break;
    case dict_t:
    case list_t:
      k = 4;
      goto LAB_006342cd;
    case string_t:
      local_fc = 0;
      while( true ) {
        lVar6 = (long)local_fc;
        lVar7 = aux::
                container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
                ::end_index((container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
                             *)(anonymous_namespace)::str_settings);
        if (lVar7 <= lVar6) break;
        local_118 = (val->m_tokens).
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        pbStack_110 = (val->m_tokens).
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        pvVar11 = aux::
                  container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
                  ::operator[]((container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
                                *)(anonymous_namespace)::str_settings,(long)local_fc);
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_128,pvVar11->name);
        __x._M_str = (char *)pbStack_110;
        __x._M_len = (size_t)local_118;
        bVar2 = ::std::operator!=(__x,local_128);
        iVar1 = local_fc;
        if (!bVar2) {
          sVar12 = bdecode_node::string_value(ptStack_90);
          local_158 = sVar12;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)&local_148,&local_158,&local_159);
          settings_pack::set_str(__return_storage_ptr__,iVar1,&local_148);
          ::std::__cxx11::string::~string((string *)&local_148);
          ::std::allocator<char>::~allocator(&local_159);
          break;
        }
        local_fc = local_fc + 1;
      }
      break;
    case int_t:
      local_95 = 0;
      local_9c = 0;
      while( true ) {
        lVar6 = (long)(int)local_9c;
        lVar7 = aux::
                container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
                ::end_index((container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
                             *)(anonymous_namespace)::int_settings);
        if (lVar7 <= lVar6) break;
        local_b8 = (val->m_tokens).
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbStack_b0 = (val->m_tokens).
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        pvVar8 = aux::
                 container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
                 ::operator[]((container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
                               *)(anonymous_namespace)::int_settings,(long)(int)local_9c);
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_c8,pvVar8->name);
        __x_01._M_str = (char *)pbStack_b0;
        __x_01._M_len = (size_t)local_b8;
        bVar2 = ::std::operator!=(__x_01,_auStack_c8);
        if (!bVar2) {
          uVar5 = local_9c | 0x4000;
          iVar9 = bdecode_node::int_value(ptStack_90);
          settings_pack::set_int(__return_storage_ptr__,uVar5,(int)iVar9);
          local_95 = 1;
          break;
        }
        local_9c = local_9c + 1;
      }
      if ((local_95 & 1) == 0) {
        local_cc = 0;
        while( true ) {
          lVar6 = (long)(int)local_cc;
          lVar7 = aux::
                  container_wrapper<libtorrent::bool_setting_entry_t,_long,_std::array<libtorrent::bool_setting_entry_t,_84UL>_>
                  ::end_index((container_wrapper<libtorrent::bool_setting_entry_t,_long,_std::array<libtorrent::bool_setting_entry_t,_84UL>_>
                               *)(anonymous_namespace)::bool_settings);
          if (lVar7 <= lVar6) break;
          local_e8 = (val->m_tokens).
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbStack_e0 = (val->m_tokens).
                       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          pvVar10 = aux::
                    container_wrapper<libtorrent::bool_setting_entry_t,_long,_std::array<libtorrent::bool_setting_entry_t,_84UL>_>
                    ::operator[]((container_wrapper<libtorrent::bool_setting_entry_t,_long,_std::array<libtorrent::bool_setting_entry_t,_84UL>_>
                                  *)(anonymous_namespace)::bool_settings,(long)(int)local_cc);
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_f8,pvVar10->name);
          __x_00._M_str = (char *)pbStack_e0;
          __x_00._M_len = (size_t)local_e8;
          bVar2 = ::std::operator!=(__x_00,_auStack_f8);
          if (!bVar2) {
            uVar5 = local_cc | 0x8000;
            iVar9 = bdecode_node::int_value(ptStack_90);
            settings_pack::set_bool(__return_storage_ptr__,uVar5,iVar9 != 0);
            break;
          }
          local_cc = local_cc + 1;
        }
        break;
      }
      k = 4;
      goto LAB_006342cd;
    }
    k = 0;
LAB_006342cd:
    ::std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>::
    ~pair((pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> *)
          &key);
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

settings_pack load_pack_from_dict(bdecode_node const& settings)
	{
		settings_pack pack;

		for (int i = 0; i < settings.dict_size(); ++i)
		{
			auto const [key, val] = settings.dict_at(i);
			switch (val.type())
			{
				case bdecode_node::dict_t:
				case bdecode_node::list_t:
					continue;
				case bdecode_node::int_t:
				{
					bool found = false;
					for (int k = 0; k < int_settings.end_index(); ++k)
					{
						if (key != int_settings[k].name) continue;
						pack.set_int(settings_pack::int_type_base | k, int(val.int_value()));
						found = true;
						break;
					}
					if (found) continue;
					for (int k = 0; k < bool_settings.end_index(); ++k)
					{
						if (key != bool_settings[k].name) continue;
						pack.set_bool(settings_pack::bool_type_base | k, val.int_value() != 0);
						break;
					}
				}
				break;
			case bdecode_node::string_t:
				for (int k = 0; k < str_settings.end_index(); ++k)
				{
					if (key != str_settings[k].name) continue;
					pack.set_str(settings_pack::string_type_base + k, std::string(val.string_value()));
					break;
				}
				break;
			case bdecode_node::none_t:
				break;
			}
		}
		return pack;
	}